

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O3

void Ssw_ManRefineByFilterSim(Ssw_Man_t *p,int nFrames)

{
  undefined1 *puVar1;
  ulong *puVar2;
  void *pvVar3;
  int iVar4;
  Aig_Man_t *pAVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswFilter.c"
                  ,0x32,"void Ssw_ManRefineByFilterSim(Ssw_Man_t *, int)");
  }
  pAVar5 = p->pAig;
  if (0 < pAVar5->nRegs) {
    iVar4 = 0;
    do {
      uVar8 = pAVar5->nTruePos + iVar4;
      if (((int)uVar8 < 0) || (pAVar5->vCos->nSize <= (int)uVar8)) {
LAB_006a7146:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar6 = pAVar5->nTruePis + iVar4;
      pvVar3 = pAVar5->vCos->pArray[uVar8];
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
           (ulong)((p->pPatWords[iVar6 >> 5] >> ((byte)iVar6 & 0x1f) & 1) << 5);
      iVar4 = iVar4 + 1;
      pAVar5 = p->pAig;
    } while (iVar4 < pAVar5->nRegs);
  }
  iVar4 = 0;
  do {
    puVar1 = &p->pAig->pConst1->field_0x18;
    *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
    pAVar5 = p->pAig;
    if (0 < pAVar5->nTruePis) {
      lVar7 = 0;
      do {
        if (pAVar5->vCis->nSize <= lVar7) goto LAB_006a7146;
        puVar2 = (ulong *)((long)pAVar5->vCis->pArray[lVar7] + 0x18);
        *puVar2 = *puVar2 & 0xffffffffffffffdf;
        lVar7 = lVar7 + 1;
        pAVar5 = p->pAig;
      } while (lVar7 < pAVar5->nTruePis);
    }
    if (0 < pAVar5->nRegs) {
      iVar6 = 0;
      do {
        uVar8 = pAVar5->nTruePos + iVar6;
        if (((((int)uVar8 < 0) || (pAVar5->vCos->nSize <= (int)uVar8)) ||
            (uVar10 = pAVar5->nTruePis + iVar6, (int)uVar10 < 0)) ||
           (pAVar5->vCis->nSize <= (int)uVar10)) goto LAB_006a7146;
        pvVar3 = pAVar5->vCis->pArray[uVar10];
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
             (ulong)((uint)*(undefined8 *)((long)pAVar5->vCos->pArray[uVar8] + 0x18) & 0x20);
        iVar6 = iVar6 + 1;
        pAVar5 = p->pAig;
      } while (iVar6 < pAVar5->nRegs);
    }
    pVVar9 = pAVar5->vObjs;
    if (0 < pVVar9->nSize) {
      lVar7 = 0;
      do {
        pvVar3 = pVVar9->pArray[lVar7];
        if ((pvVar3 != (void *)0x0) &&
           (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                        *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18) >>
                        5) & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                             *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)
                             >> 5) & 1) << 5);
          pAVar5 = p->pAig;
        }
        lVar7 = lVar7 + 1;
        pVVar9 = pAVar5->vObjs;
      } while (lVar7 < pVVar9->nSize);
    }
    pVVar9 = pAVar5->vCos;
    if (0 < pVVar9->nSize) {
      lVar7 = 0;
      do {
        pvVar3 = pVVar9->pArray[lVar7];
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
             (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^
                     *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
        lVar7 = lVar7 + 1;
        pAVar5 = p->pAig;
        pVVar9 = pAVar5->vCos;
      } while (lVar7 < pVVar9->nSize);
    }
    if (iVar4 == 0) {
      pVVar9 = pAVar5->vObjs;
      if (0 < pVVar9->nSize) {
        lVar7 = 0;
        do {
          pvVar3 = pVVar9->pArray[lVar7];
          if (pvVar3 != (void *)0x0) {
            *(ulong *)((long)pvVar3 + 0x18) =
                 *(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffff7 |
                 (ulong)((uint)(*(ulong *)((long)pvVar3 + 0x18) >> 2) & 8);
            pAVar5 = p->pAig;
          }
          lVar7 = lVar7 + 1;
          pVVar9 = pAVar5->vObjs;
        } while (lVar7 < pVVar9->nSize);
      }
    }
    else {
      Ssw_ClassesRefineConst1(p->ppClasses,0);
      Ssw_ClassesRefine(p->ppClasses,0);
    }
    iVar4 = iVar4 + 1;
    if (iVar4 == nFrames) {
      return;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Performs fraiging for one node.]

  Description [Returns the fraiged node.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManRefineByFilterSim( Ssw_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i, RetValue1, RetValue2;
    assert( nFrames > 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
    // simulate the timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = 0;
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
        // transfer
        if ( f == 0 )
        { // copy markB into phase
            Aig_ManForEachObj( p->pAig, pObj, i )
                pObj->fPhase = pObj->fMarkB;
        }
        else
        { // refine classes
            RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 0 );
            RetValue2 = Ssw_ClassesRefine( p->ppClasses, 0 );
        }
    }
}